

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O0

VariableType * __thiscall rsg::VariableType::getElementType(VariableType *this)

{
  Type TVar1;
  VariableType *pVVar2;
  Exception *this_00;
  allocator<char> local_39;
  string local_38;
  VariableType *local_18;
  VariableType *this_local;
  
  TVar1 = this->m_baseType;
  local_18 = this;
  if (2 < TVar1 - TYPE_FLOAT) {
    if (TVar1 == TYPE_ARRAY) {
      return this->m_elementType;
    }
    if (TVar1 != TYPE_SAMPLER_2D && TVar1 != TYPE_SAMPLER_CUBE) {
      this_00 = (Exception *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"VariableType::getElementType(): unsupported type",&local_39);
      Exception::Exception(this_00,&local_38);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  }
  pVVar2 = getScalarType(this->m_baseType);
  return pVVar2;
}

Assistant:

const VariableType& VariableType::getElementType (void) const
{
	DE_ASSERT(m_precision == PRECISION_NONE); // \todo [pyry] Precision
	switch (m_baseType)
	{
		case TYPE_FLOAT:
		case TYPE_INT:
		case TYPE_BOOL:
		case TYPE_SAMPLER_2D:
		case TYPE_SAMPLER_CUBE:
			return getScalarType(m_baseType);

		case TYPE_ARRAY:
		{
			DE_ASSERT(m_elementType);
			return *m_elementType;
		}

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("VariableType::getElementType(): unsupported type");
	}
}